

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O2

double __thiscall IF97::Region3::lambda1(Region3 *this,double T,double rho)

{
  double dVar1;
  size_t i;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = 0.0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(this->lamJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->lamJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    dVar4 = powi(647.096 / T + -1.0,
                 (this->lamIr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar2]);
    dVar1 = (this->lamnr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar2];
    dVar5 = powi(rho / 322.0 + -1.0,
                 (this->lamJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar2]);
    dVar3 = dVar3 + dVar5 * dVar4 * (rho / 322.0) * dVar1;
  }
  dVar3 = exp(dVar3);
  return dVar3;
}

Assistant:

double lambda1(double T, double rho) const{
            const double rho_bar = rho/Rhocrit;
            double summer = 0.0;
            for (std::size_t i = 0; i < lamJr.size(); ++i){
                summer += rho_bar * powi(Trterm(T),lamIr[i]) * lamnr[i]*powi(Rhorterm(rho),lamJr[i]);
            }
            return exp(summer);
        }